

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context.h
# Opt level: O2

void __thiscall
r_exec::IPGMContext::copy_member<r_exec::View>
          (IPGMContext *this,View *destination,uint16_t write_index,uint16_t *extent_index,
          bool dereference_cptr,int64_t pgm_index)

{
  Overlay *pOVar1;
  byte bVar2;
  char cVar3;
  undefined1 uVar4;
  ushort uVar5;
  int iVar6;
  undefined4 extraout_var;
  Atom *pAVar8;
  undefined7 in_register_00000081;
  IPGMContext c;
  Atom local_8c [4];
  undefined4 local_88;
  Atom local_84 [4];
  Atom local_80 [4];
  Atom local_7c [4];
  IPGMContext local_78;
  Code *local_48;
  View *pVStack_40;
  Code *pCVar7;
  
  local_88 = (undefined4)CONCAT71(in_register_00000081,dereference_cptr);
  bVar2 = r_code::Atom::getDescriptor();
  if (bVar2 - 0xc1 < 0xe) {
    local_48 = (Code *)extent_index;
    r_code::Atom::IPointer((ushort)(local_7c + 4));
    r_code::Atom::operator=
              ((Atom *)((long)(destination->super_View).references + (ulong)write_index * 4 + 0x18),
               local_7c + 4);
    r_code::Atom::~Atom(local_7c + 4);
    if (((0 < pgm_index) && (uVar5 = (this->super__Context).index, (ulong)pgm_index < (ulong)uVar5))
       && ((this->super__Context).data == STEM)) {
      r_code::Atom::OutObjPointer((ushort)local_84);
      _Context::patch_code(&this->super__Context,uVar5,local_84);
      r_code::Atom::~Atom(local_84);
    }
    copy_structure<r_exec::View>
              (this,destination,*(uint16_t *)local_48,(uint16_t *)local_48,(bool)(char)local_88,
               pgm_index);
    return;
  }
  switch(bVar2) {
  case 0x83:
    r_code::Atom::operator=
              ((Atom *)((long)(destination->super_View).references + (ulong)write_index * 4 + 0x18),
               (this->super__Context).code + (ulong)(this->super__Context).index * 4);
    return;
  case 0x84:
  case 0x87:
  case 0x89:
    if ((this->super__Context).index != 0 || (this->super__Context).data != REFERENCE) {
      r_code::Atom::asIndex();
      cVar3 = r_code::Atom::getDescriptor();
      if (cVar3 == -0x40) {
        if ((char)local_88 == '\0') {
LAB_001a7aca:
          pAVar8 = (this->super__Context).code;
          local_48 = this->object;
          pVStack_40 = this->view;
          local_78.super__Context.index = r_code::Atom::asIndex();
          local_78.super__Context.overlay = (this->super__Context).overlay;
          local_78.super__Context.data = (this->super__Context).data;
          local_78.super__Context._vptr__Context = (_func_int **)&PTR___Context_001d0488;
          local_78.object = local_48;
          local_78.view = pVStack_40;
          local_78.super__Context.code = pAVar8;
          r_code::Atom::IPointer((ushort)local_8c);
          r_code::Atom::operator=
                    ((Atom *)((long)(destination->super_View).references +
                             (ulong)write_index * 4 + 0x18),local_8c);
          r_code::Atom::~Atom(local_8c);
          copy_structure<r_exec::View>
                    ((IPGMContext *)(local_7c + 4),destination,*extent_index,extent_index,
                     (bool)(char)local_88,pgm_index);
          return;
        }
        if (0 < pgm_index) {
          r_code::Atom::asIndex();
          uVar5 = r_code::Atom::asIndex();
          if ((ulong)pgm_index < (ulong)uVar5) goto LAB_001a7aca;
        }
      }
      operator*((IPGMContext *)(local_7c + 4),this);
      cVar3 = r_code::Atom::isStructural();
      if (cVar3 != '\0') {
        r_code::Atom::IPointer((ushort)local_8c);
        r_code::Atom::operator=
                  ((Atom *)((long)(destination->super_View).references +
                           (ulong)write_index * 4 + 0x18),local_8c);
        r_code::Atom::~Atom(local_8c);
        if (((0 < pgm_index) &&
            (uVar5 = (this->super__Context).index, (ulong)pgm_index < (ulong)uVar5)) &&
           ((this->super__Context).data == STEM)) {
          r_code::Atom::OutObjPointer((ushort)local_80);
          _Context::patch_code(&this->super__Context,uVar5,local_80);
          r_code::Atom::~Atom(local_80);
        }
        copy_structure<r_exec::View>
                  ((IPGMContext *)(local_7c + 4),destination,*extent_index,extent_index,
                   (bool)(char)local_88,pgm_index);
        return;
      }
      r_code::Atom::operator=
                ((Atom *)((long)(destination->super_View).references + (ulong)write_index * 4 + 0x18
                         ),
                 (Atom *)((long)local_78.super__Context.code +
                         (ulong)local_78.super__Context.index * 4));
      return;
    }
    pCVar7 = this->object;
    break;
  case 0x85:
    pCVar7 = this->object;
    uVar5 = r_code::Atom::asIndex();
    iVar6 = (*(pCVar7->super__Object)._vptr__Object[9])(pCVar7,(ulong)uVar5);
    pCVar7 = (Code *)CONCAT44(extraout_var,iVar6);
    break;
  case 0x86:
    r_code::Atom::asIndex();
    uVar4 = r_code::Atom::getDescriptor();
    switch(uVar4) {
    case 0x84:
      r_code::Atom::asIndex();
      r_code::Atom::asIndex();
      cVar3 = r_code::Atom::getDescriptor();
      if (cVar3 != -0x78) goto switchD_001a7c93_caseD_85;
      pOVar1 = (this->super__Context).overlay;
      r_code::Atom::asIndex();
      r_code::Atom::asIndex();
      bVar2 = r_code::Atom::asInputIndex();
      pCVar7 = *(Code **)(pOVar1[2].super__Object._vptr__Object[bVar2] + 0x20);
      break;
    default:
switchD_001a7c93_caseD_85:
      operator*((IPGMContext *)(local_7c + 4),this);
      copy_member<r_exec::View>
                ((IPGMContext *)(local_7c + 4),destination,write_index,extent_index,
                 (bool)(char)local_88,pgm_index);
      return;
    case 0x88:
    case 0x8c:
      operator*((IPGMContext *)(local_7c + 4),this);
      if (local_78.super__Context.index == 0) {
        addReference(this,destination,write_index,local_78.object);
        return;
      }
      cVar3 = r_code::Atom::isStructural();
      if (cVar3 != '\0') {
        r_code::Atom::IPointer((ushort)local_8c);
        r_code::Atom::operator=
                  ((Atom *)((long)(destination->super_View).references +
                           (ulong)write_index * 4 + 0x18),local_8c);
        r_code::Atom::~Atom(local_8c);
        copy_structure<r_exec::View>
                  ((IPGMContext *)(local_7c + 4),destination,*extent_index,extent_index,
                   (bool)(char)local_88,pgm_index);
        return;
      }
      copy_member<r_exec::View>
                ((IPGMContext *)(local_7c + 4),destination,write_index,extent_index,
                 (bool)(char)local_88,pgm_index);
      return;
    case 0x8a:
      pOVar1 = (this->super__Context).overlay;
      r_code::Atom::asIndex();
      uVar5 = r_code::Atom::asIndex();
      pCVar7 = (Code *)pOVar1[1].super__Object._vptr__Object[uVar5];
      break;
    case 0x8b:
      r_code::Atom::asIndex();
      uVar5 = r_code::Atom::asIndex();
      r_code::Atom::VLPointer((ushort)(local_7c + 4),uVar5);
      r_code::Atom::operator=
                ((Atom *)((long)(destination->super_View).references + (ulong)write_index * 4 + 0x18
                         ),local_7c + 4);
      pAVar8 = local_7c + 4;
      goto LAB_001a7f93;
    }
    break;
  case 0x88:
    pOVar1 = (this->super__Context).overlay;
    uVar5 = r_code::Atom::asIndex();
    pCVar7 = *(Code **)(pOVar1[2].super__Object._vptr__Object[uVar5] + 0x20);
    break;
  case 0x8a:
    pOVar1 = (this->super__Context).overlay;
    uVar5 = r_code::Atom::asIndex();
    pCVar7 = (Code *)pOVar1[1].super__Object._vptr__Object[uVar5];
    break;
  default:
    r_code::Atom::operator=
              ((Atom *)((long)(destination->super_View).references + (ulong)write_index * 4 + 0x18),
               (this->super__Context).code + (ulong)(this->super__Context).index * 4);
    if (pgm_index < 1) {
      return;
    }
    uVar5 = (this->super__Context).index;
    if ((ulong)uVar5 <= (ulong)pgm_index) {
      return;
    }
    if ((this->super__Context).data != STEM) {
      return;
    }
    r_code::Atom::OutObjPointer((ushort)local_7c);
    _Context::patch_code(&this->super__Context,uVar5,local_7c);
    pAVar8 = local_7c;
LAB_001a7f93:
    r_code::Atom::~Atom(pAVar8);
    return;
  case 0x8c:
    operator*((IPGMContext *)(local_7c + 4),this);
    addReference(this,destination,write_index,local_78.object);
    return;
  }
  addReference(this,destination,write_index,pCVar7);
  return;
}

Assistant:

void copy_member(C *destination,
                                       uint16_t write_index,
                                       uint16_t &extent_index,
                                       bool dereference_cptr,
                                       int64_t pgm_index) const
    {
        switch ((*this)[0].getDescriptor()) {
        case Atom::I_PTR:
        case Atom::VALUE_PTR:
        case Atom::IPGM_PTR: {
            if (data == REFERENCE && index == 0) { // points to an object, not to one of its members.
                addReference(destination, write_index, object);
                break;
            }

            if (code[(*this)[0].asIndex()].getDescriptor() == Atom::C_PTR) {
                if (!dereference_cptr || (pgm_index > 0 && code[(*this)[0].asIndex() + 1].asIndex() > pgm_index)) { // the latter case occurs when a cptr references code inside a pgm being copied.
                    IPGMContext c = IPGMContext(object, view, code, (*this)[0].asIndex(), (InputLessPGMOverlay *)overlay, data);
                    destination->code(write_index) = Atom::IPointer(extent_index);
                    c.copy_structure(destination, extent_index, extent_index, dereference_cptr, pgm_index);
                    break;
                }
            }

            IPGMContext c = **this;

            if (c[0].isStructural()) {
                destination->code(write_index) = Atom::IPointer(extent_index);

                if (pgm_index > 0 && index > pgm_index && data == STEM) {
                    this->patch_code(index, Atom::OutObjPointer(write_index));
                }

                c.copy_structure(destination, extent_index, extent_index, dereference_cptr, pgm_index);
            } else {
                destination->code(write_index) = c[0];
            }

            break;
        }

        case Atom::VL_PTR:
            switch (code[(*this)[0].asIndex()].getDescriptor()) {
            case Atom::PROD_PTR:
                addReference(destination, write_index, ((InputLessPGMOverlay *)overlay)->productions[code[(*this)[0].asIndex()].asIndex()]);
                break;

            case Atom::I_PTR:
                if (code[code[(*this)[0].asIndex()].asIndex()].getDescriptor() == Atom::IN_OBJ_PTR) {
                    addReference(destination, write_index, ((PGMOverlay *)overlay)->getInputObject(code[code[(*this)[0].asIndex()].asIndex()].asInputIndex()));
                } else {
                    (**this).copy_member(destination, write_index, extent_index, dereference_cptr, pgm_index);
                }

                break;

            case Atom::OUT_OBJ_PTR:
                destination->code(write_index) = Atom::VLPointer(code[(*this)[0].asIndex()].asIndex());
                break;

            case Atom::IN_OBJ_PTR:
            case Atom::D_IN_OBJ_PTR: {
                IPGMContext c = **this;

                if (c.index == 0) {
                    addReference(destination, write_index, c.object);
                } else if (c[0].isStructural()) {
                    destination->code(write_index++) = Atom::IPointer(extent_index);
                    c.copy_structure(destination, extent_index, extent_index, dereference_cptr, pgm_index);
                } else {
                    c.copy_member(destination, write_index, extent_index, dereference_cptr, pgm_index);
                }

                break;
            }

            default:
                (**this).copy_member(destination, write_index, extent_index, dereference_cptr, pgm_index);
                break;
            }

            break;

        case Atom::R_PTR:
            addReference(destination, write_index, object->get_reference((*this)[0].asIndex()));
            break;

        case Atom::PROD_PTR:
            addReference(destination, write_index, ((InputLessPGMOverlay *)overlay)->productions[(*this)[0].asIndex()]);
            break;

        case Atom::IN_OBJ_PTR:
            addReference(destination, write_index, ((PGMOverlay *)overlay)->getInputObject((*this)[0].asIndex()));
            break;

        case Atom::D_IN_OBJ_PTR: {
            IPGMContext c = **this;
            addReference(destination, write_index, c.object);
            break;
        }

        case Atom::OPERATOR:
        case Atom::OBJECT:
        case Atom::MARKER:
        case Atom::INSTANTIATED_PROGRAM:
        case Atom::INSTANTIATED_CPP_PROGRAM:
        case Atom::INSTANTIATED_INPUT_LESS_PROGRAM:
        case Atom::INSTANTIATED_ANTI_PROGRAM:
        case Atom::COMPOSITE_STATE:
        case Atom::MODEL:
        case Atom::GROUP:
        case Atom::SET:
        case Atom::S_SET:
        case Atom::TIMESTAMP:
        case Atom::STRING:
            destination->code(write_index) = Atom::IPointer(extent_index);

            if (pgm_index > 0 && index > pgm_index && data == STEM) {
                this->patch_code(index, Atom::OutObjPointer(write_index));
            }

            copy_structure(destination, extent_index, extent_index, dereference_cptr, pgm_index);
            break;

        case Atom::T_WILDCARD:
            destination->code(write_index) = (*this)[0];
            break;

        default:
            destination->code(write_index) = (*this)[0];

            if (pgm_index > 0 && index > pgm_index && data == STEM) {
                this->patch_code(index, Atom::OutObjPointer(write_index));
            }

            break;
        }
    }